

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPdr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pDriver;
  char *pcVar3;
  char *pcVar4;
  char *local_108;
  Pdr_Par_t Pars;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Pdr_ManSetDefaultParams(&Pars);
  local_108 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00243ddb:
  iVar1 = Extra_UtilGetopt(argc,argv,"MFCDQTHGSLIaxrmuyfqipdegjonctkvwzh");
  iVar2 = globalUtilOptind;
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nConfLimit = iVar1;
LAB_00244002:
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_00243dfb_caseD_45:
      Abc_Print(-2,"usage: pdr [-MFCDQTHGS <num>] [-LI <file>] [-axrmuyfqipdegjonctkvwzh]\n");
      Abc_Print(-2,"\t         model checking using property directed reachability (aka IC3)\n");
      Abc_Print(-2,
                "\t         pioneered by Aaron R. Bradley (http://theory.stanford.edu/~arbrad/)\n");
      Abc_Print(-2,"\t         with improvements by Niklas Een (http://een.se/niklas/)\n");
      Abc_Print(-2,
                "\t-M num : limit on unused vars to trigger SAT solver recycling [default = %d]\n",
                (ulong)(uint)Pars.nRecycle);
      Abc_Print(-2,"\t-F num : limit on timeframes explored to stop computation [default = %d]\n",
                (ulong)(uint)Pars.nFrameMax);
      Abc_Print(-2,"\t-C num : limit on conflicts in one SAT call (0 = no limit) [default = %d]\n",
                (ulong)(uint)Pars.nConfLimit);
      Abc_Print(-2,
                "\t-D num : limit on conflicts during ind-generalization (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nConfGenLimit);
      Abc_Print(-2,
                "\t-Q num : limit on proof obligations before a restart (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nRestLimit);
      Abc_Print(-2,"\t-T num : runtime limit, in seconds (0 = no limit) [default = %d]\n",
                (ulong)(uint)Pars.nTimeOut);
      Abc_Print(-2,
                "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n"
                ,(ulong)(uint)Pars.nTimeOutOne);
      Abc_Print(-2,"\t-G num : runtime gap since the last CEX (0 = no limit) [default = %d]\n",
                (ulong)(uint)Pars.nTimeOutGap);
      Abc_Print(-2,"\t-S num : * value to seed the SAT solver with [default = %d]\n",
                (ulong)(uint)Pars.nRandomSeed);
      pcVar4 = "no logging";
      if (local_108 != (char *)0x0) {
        pcVar4 = local_108;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar4);
      pcVar4 = "default name";
      if (Pars.pInvFileName != (char *)0x0) {
        pcVar4 = Pars.pInvFileName;
      }
      Abc_Print(-2,"\t-I file: the invariant file name [default = %s]\n",pcVar4);
      pcVar3 = "yes";
      pcVar4 = "yes";
      if (Pars.fSolveAll == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs even if one of them is SAT [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fStoreCex == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fTwoRounds == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle using more effort in generalization [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fMonoCnf == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using monolythic CNF computation [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fNewXSim == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle updated X-valued simulation [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fFlopPrio == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-y     : toggle using structural flop priorities [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fFlopOrder == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle ordering flops by cost before generalization [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fShortest == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle creating only shortest counter-examples [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fShiftStart == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-i     : toggle clause pushing from an intermediate timeframe [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fReuseProofOblig == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-p     : toggle reusing proof-obligations in the last timeframe [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fDumpInv == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-d     : toggle dumping invariant (valid if init state is all-0) [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fUseSupp == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-e     : toggle using only support variables in the invariant [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fSkipGeneral == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle skipping expensive generalization step [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fSimpleGeneral == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-j     : toggle using simplified generalization step [default = %s]\n",pcVar4)
      ;
      pcVar4 = "yes";
      if (Pars.fUsePropOut == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggle using property output as inductive hypothesis [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fSkipDown == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-n     : * toggle skipping \'down\' in generalization [default = %s]\n",pcVar4
               );
      pcVar4 = "yes";
      if (Pars.fCtgs == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : * toggle handling CTGs in \'down\' [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fUseAbs == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using abstraction [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fUseSimpleRef == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-k     : toggle using simplified refinement [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing detailed stats default = %s]\n",pcVar4);
      if (Pars.fNotVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n\n");
      Abc_Print(-2,"\t* Implementation of switches -S, -n, and -c is contributed by Zyad Hassan.\n")
      ;
      Abc_Print(-2,
                "\t  The theory and experiments supporting this work can be found in the following paper:\n"
               );
      Abc_Print(-2,
                "\t  Zyad Hassan, Aaron R. Bradley, Fabio Somenzi, \"Better Generalization in IC3\", FMCAD 2013.\n"
               );
      Abc_Print(-2,
                "\t  (http://www.cs.utexas.edu/users/hunt/FMCAD/FMCAD13/papers/85-Better-Generalization-IC3.pdf)\n"
               );
      return 1;
    }
    goto LAB_00243ddb;
  case 0x44:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nConfGenLimit = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x52:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6c:
  case 0x73:
    goto switchD_00243dfb_caseD_45;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFrameMax = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOutGap = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x48:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOutOne = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      Pars.pInvFileName = argv[globalUtilOptind];
LAB_00243fc6:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00243ddb;
    }
    pcVar4 = "Command line switch \"-I\" should be followed by a file name.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_108 = argv[globalUtilOptind];
      goto LAB_00243fc6;
    }
    pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRecycle = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRestLimit = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRandomSeed = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOut = iVar1;
      goto LAB_00244002;
    }
    pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x61:
    Pars.fSolveAll = Pars.fSolveAll ^ 1;
    goto LAB_00243ddb;
  case 99:
    Pars.fCtgs = Pars.fCtgs ^ 1;
    goto LAB_00243ddb;
  case 100:
    Pars.fDumpInv = Pars.fDumpInv ^ 1;
    goto LAB_00243ddb;
  case 0x65:
    Pars.fUseSupp = Pars.fUseSupp ^ 1;
    goto LAB_00243ddb;
  case 0x66:
    Pars.fFlopOrder = Pars.fFlopOrder ^ 1;
    goto LAB_00243ddb;
  case 0x67:
    Pars.fSkipGeneral = Pars.fSkipGeneral ^ 1;
    goto LAB_00243ddb;
  case 0x69:
    Pars.fShiftStart = Pars.fShiftStart ^ 1;
    goto LAB_00243ddb;
  case 0x6a:
    Pars.fSimpleGeneral = Pars.fSimpleGeneral ^ 1;
    goto LAB_00243ddb;
  case 0x6b:
    Pars.fUseSimpleRef = Pars.fUseSimpleRef ^ 1;
    goto LAB_00243ddb;
  case 0x6d:
    Pars.fMonoCnf = Pars.fMonoCnf ^ 1;
    goto LAB_00243ddb;
  case 0x6e:
    Pars.fSkipDown = Pars.fSkipDown ^ 1;
    goto LAB_00243ddb;
  case 0x6f:
    Pars.fUsePropOut = Pars.fUsePropOut ^ 1;
    goto LAB_00243ddb;
  case 0x70:
    Pars.fReuseProofOblig = Pars.fReuseProofOblig ^ 1;
    goto LAB_00243ddb;
  case 0x71:
    Pars.fShortest = Pars.fShortest ^ 1;
    goto LAB_00243ddb;
  case 0x72:
    Pars.fTwoRounds = Pars.fTwoRounds ^ 1;
    goto LAB_00243ddb;
  case 0x74:
    Pars.fUseAbs = Pars.fUseAbs ^ 1;
    goto LAB_00243ddb;
  case 0x75:
    Pars.fNewXSim = Pars.fNewXSim ^ 1;
    goto LAB_00243ddb;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_00243ddb;
  case 0x77:
    Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
    goto LAB_00243ddb;
  case 0x78:
    Pars.fStoreCex = Pars.fStoreCex ^ 1;
    goto LAB_00243ddb;
  case 0x79:
    Pars.fFlopPrio = Pars.fFlopPrio ^ 1;
    goto LAB_00243ddb;
  case 0x7a:
    Pars.fNotVerbose = Pars.fNotVerbose ^ 1;
    goto LAB_00243ddb;
  default:
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar4 = "There is no current network.\n";
      }
      else {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if ((pAbc->fBatchMode == 0) || (1 < (uint)pAbc->Status)) {
            if (pNtk->nObjCounts[8] == 0) {
              pNtk_00 = Abc_NtkDup(pNtk);
              pDriver = Abc_AigConst1(pNtk_00);
              Abc_NtkAddLatch(pNtk_00,pDriver,ABC_INIT_ONE);
            }
            else {
              pNtk_00 = (Abc_Ntk_t *)0x0;
            }
            Pars.fUseBridge = pAbc->fBridgeMode;
            if (pNtk_00 != (Abc_Ntk_t *)0x0) {
              pNtk = pNtk_00;
            }
            iVar2 = Abc_NtkDarPdr(pNtk,&Pars);
            pAbc->Status = iVar2;
            pAbc->nFrames = -(uint)(pNtk->vSeqModelVec != (Vec_Ptr_t *)0x0) | Pars.iFrame;
            Abc_FrameReplacePoStatuses(pAbc,&Pars.vOutMap);
            if (pNtk->vSeqModelVec == (Vec_Ptr_t *)0x0) {
              Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
            }
            else {
              Abc_FrameReplaceCexVec(pAbc,&pNtk->vSeqModelVec);
            }
            if (pNtk_00 != (Abc_Ntk_t *)0x0) {
              Abc_NtkDelete(pNtk_00);
            }
            if (local_108 == (char *)0x0) {
              return 0;
            }
            Abc_NtkWriteLogFile(local_108,pAbc->pCex,pAbc->Status,pAbc->nFrames,"pdr");
            return 0;
          }
          pcVar4 = "The miters is already solved; skipping the command.\n";
          iVar2 = 1;
          goto LAB_0024455c;
        }
        pcVar4 = "The current network is not an AIG (run \"strash\").\n";
      }
      iVar2 = -2;
LAB_0024455c:
      Abc_Print(iVar2,pcVar4);
      return 0;
    }
    goto switchD_00243dfb_caseD_45;
  }
  Abc_Print(-1,pcVar4);
  goto switchD_00243dfb_caseD_45;
}

Assistant:

int Abc_CommandPdr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarPdr( Abc_Ntk_t * pNtk, Pdr_Par_t * pPars );
    Pdr_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkUsed, * pNtkFlop = NULL;
    char * pLogFileName = NULL;
    int c;
    Pdr_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MFCDQTHGSLIaxrmuyfqipdegjonctkvwzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRecycle = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRecycle < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrameMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfGenLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfGenLimit < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutOne = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutOne < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutGap < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandomSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandomSeed < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pInvFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'x':
            pPars->fStoreCex ^= 1;
            break;
        case 'r':
            pPars->fTwoRounds ^= 1;
            break;
        case 'm':
            pPars->fMonoCnf ^= 1;
            break;
        case 'u':
            pPars->fNewXSim ^= 1;
            break;
        case 'y':
            pPars->fFlopPrio ^= 1;
            break;
        case 'f':
            pPars->fFlopOrder ^= 1;
            break;
        case 'q':
            pPars->fShortest ^= 1;
            break;
        case 'i':
            pPars->fShiftStart ^= 1;
            break;
        case 'p':
            pPars->fReuseProofOblig ^= 1;
            break;
        case 'd':
            pPars->fDumpInv ^= 1;
            break;
        case 'e':
            pPars->fUseSupp ^= 1;
            break;
        case 'g':
            pPars->fSkipGeneral ^= 1;
            break;
        case 'j':
            pPars->fSimpleGeneral ^= 1;
            break;
        case 'o':
            pPars->fUsePropOut ^= 1;
            break;
        case 'n':
            pPars->fSkipDown ^= 1;
            break;
        case 'c':
            pPars->fCtgs ^= 1;
            break;
        case 't':
            pPars->fUseAbs ^= 1;
            break;
        case 'k':
            pPars->fUseSimpleRef ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -2, "There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -2, "The current network is not an AIG (run \"strash\").\n");
        return 0;
    }
    if ( pAbc->fBatchMode && (pAbc->Status == 0 || pAbc->Status == 1) ) 
    { 
        Abc_Print( 1, "The miters is already solved; skipping the command.\n" ); 
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        pNtkFlop = Abc_NtkDup( pNtk );
        Abc_NtkAddLatch( pNtkFlop, Abc_AigConst1(pNtkFlop), ABC_INIT_ONE );
    }
    // run the procedure
    pPars->fUseBridge = pAbc->fBridgeMode;
    pNtkUsed = pNtkFlop ? pNtkFlop : pNtk;
    pAbc->Status  = Abc_NtkDarPdr( pNtkUsed, pPars );
    pAbc->nFrames = pNtkUsed->vSeqModelVec ? -1 : pPars->iFrame;
    Abc_FrameReplacePoStatuses( pAbc, &pPars->vOutMap );
    if ( pNtkUsed->vSeqModelVec )
        Abc_FrameReplaceCexVec( pAbc, &pNtkUsed->vSeqModelVec );
    else
        Abc_FrameReplaceCex( pAbc, &pNtkUsed->pSeqModel );
    if ( pNtkFlop ) Abc_NtkDelete( pNtkFlop );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "pdr" );
    return 0;

usage:
    Abc_Print( -2, "usage: pdr [-MFCDQTHGS <num>] [-LI <file>] [-axrmuyfqipdegjonctkvwzh]\n" );
    Abc_Print( -2, "\t         model checking using property directed reachability (aka IC3)\n" );
    Abc_Print( -2, "\t         pioneered by Aaron R. Bradley (http://theory.stanford.edu/~arbrad/)\n" );
    Abc_Print( -2, "\t         with improvements by Niklas Een (http://een.se/niklas/)\n" );
    Abc_Print( -2, "\t-M num : limit on unused vars to trigger SAT solver recycling [default = %d]\n",       pPars->nRecycle );
    Abc_Print( -2, "\t-F num : limit on timeframes explored to stop computation [default = %d]\n",           pPars->nFrameMax );
    Abc_Print( -2, "\t-C num : limit on conflicts in one SAT call (0 = no limit) [default = %d]\n",          pPars->nConfLimit );
    Abc_Print( -2, "\t-D num : limit on conflicts during ind-generalization (0 = no limit) [default = %d]\n",pPars->nConfGenLimit );
    Abc_Print( -2, "\t-Q num : limit on proof obligations before a restart (0 = no limit) [default = %d]\n", pPars->nRestLimit );
    Abc_Print( -2, "\t-T num : runtime limit, in seconds (0 = no limit) [default = %d]\n",                   pPars->nTimeOut );
    Abc_Print( -2, "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n",     pPars->nTimeOutOne );
    Abc_Print( -2, "\t-G num : runtime gap since the last CEX (0 = no limit) [default = %d]\n",              pPars->nTimeOutGap );
    Abc_Print( -2, "\t-S num : * value to seed the SAT solver with [default = %d]\n",                          pPars->nRandomSeed );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                                          pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-I file: the invariant file name [default = %s]\n",                                    pPars->pInvFileName ? pPars->pInvFileName : "default name" );
    Abc_Print( -2, "\t-a     : toggle solving all outputs even if one of them is SAT [default = %s]\n",      pPars->fSolveAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",              pPars->fStoreCex? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle using more effort in generalization [default = %s]\n",                 pPars->fTwoRounds? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using monolythic CNF computation [default = %s]\n",                    pPars->fMonoCnf? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle updated X-valued simulation [default = %s]\n",                         pPars->fNewXSim? "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle using structural flop priorities [default = %s]\n",                    pPars->fFlopPrio? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle ordering flops by cost before generalization [default = %s]\n",        pPars->fFlopOrder? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle creating only shortest counter-examples [default = %s]\n",             pPars->fShortest? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle clause pushing from an intermediate timeframe [default = %s]\n",       pPars->fShiftStart? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle reusing proof-obligations in the last timeframe [default = %s]\n",     pPars->fReuseProofOblig? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant (valid if init state is all-0) [default = %s]\n",    pPars->fDumpInv? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle using only support variables in the invariant [default = %s]\n",       pPars->fUseSupp? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle skipping expensive generalization step [default = %s]\n",              pPars->fSkipGeneral? "yes": "no" );
    Abc_Print( -2, "\t-j     : toggle using simplified generalization step [default = %s]\n",                pPars->fSimpleGeneral? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using property output as inductive hypothesis [default = %s]\n",       pPars->fUsePropOut? "yes": "no" );
    Abc_Print( -2, "\t-n     : * toggle skipping \'down\' in generalization [default = %s]\n",                 pPars->fSkipDown? "yes": "no" );
    Abc_Print( -2, "\t-c     : * toggle handling CTGs in \'down\' [default = %s]\n",                           pPars->fCtgs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using abstraction [default = %s]\n",                                   pPars->fUseAbs? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle using simplified refinement [default = %s]\n",                         pPars->fUseSimpleRef? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n",                       pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing detailed stats default = %s]\n",                              pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",             pPars->fNotVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n\n");
    Abc_Print( -2, "\t* Implementation of switches -S, -n, and -c is contributed by Zyad Hassan.\n");
    Abc_Print( -2, "\t  The theory and experiments supporting this work can be found in the following paper:\n");
    Abc_Print( -2, "\t  Zyad Hassan, Aaron R. Bradley, Fabio Somenzi, \"Better Generalization in IC3\", FMCAD 2013.\n");
    Abc_Print( -2, "\t  (http://www.cs.utexas.edu/users/hunt/FMCAD/FMCAD13/papers/85-Better-Generalization-IC3.pdf)\n");



    return 1;
}